

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

int __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::close
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,int __fd)

{
  pointer ppVar1;
  int iVar2;
  pointer ppDVar3;
  pointer ppDVar4;
  
  ppDVar3 = (this->dic_).
            super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar4 = (this->dic_).
                 super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppDVar4 != ppDVar3; ppDVar4 = ppDVar4 + 1
      ) {
    if (*ppDVar4 != (Dictionary *)0x0) {
      (*(*ppDVar4)->_vptr_Dictionary[1])();
    }
    ppDVar3 = (this->dic_).
              super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppDVar4 = (this->dic_).
            super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppDVar3 != ppDVar4) {
    (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppDVar4;
  }
  ppVar1 = (this->unk_tokens_).
           super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->unk_tokens_).
      super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->unk_tokens_).
    super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  iVar2 = CharProperty::close(&this->property_,__fd);
  return iVar2;
}

Assistant:

void Tokenizer<N, P>::close() {
  for (std::vector<Dictionary *>::iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    delete *it;
  }
  dic_.clear();
  unk_tokens_.clear();
  property_.close();
}